

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_fill_set(lyxp_set *trg,lyxp_set *src)

{
  char *string;
  lyxp_set_node *plVar1;
  size_t sVar2;
  hash_table *phVar3;
  lyxp_set *src_local;
  lyxp_set *trg_local;
  
  if ((trg != (lyxp_set *)0x0) && (src != (lyxp_set *)0x0)) {
    if (src->type == LYXP_SET_SNODE_SET) {
      trg->type = LYXP_SET_SNODE_SET;
      trg->used = src->used;
      trg->size = src->used;
      plVar1 = (lyxp_set_node *)ly_realloc((trg->val).nodes,(ulong)trg->size << 4);
      (trg->val).nodes = plVar1;
      if ((trg->val).nodes == (lyxp_set_node *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_fill_set");
        memset(trg,0,0x40);
      }
      else {
        memcpy((trg->val).nodes,(src->val).nodes,(ulong)src->used << 4);
      }
    }
    else if (src->type == LYXP_SET_BOOLEAN) {
      set_fill_boolean(trg,(src->val).bool);
    }
    else if (src->type == LYXP_SET_NUMBER) {
      set_fill_number(trg,(src->val).num);
    }
    else if (src->type == LYXP_SET_STRING) {
      string = (src->val).str;
      sVar2 = strlen((src->val).str);
      set_fill_string(trg,string,(uint16_t)sVar2);
    }
    else {
      if (trg->type == LYXP_SET_NODE_SET) {
        free((trg->val).nodes);
      }
      else if (trg->type == LYXP_SET_STRING) {
        free((trg->val).nodes);
      }
      if (src->type == LYXP_SET_EMPTY) {
        trg->type = LYXP_SET_EMPTY;
      }
      else {
        if (src->type != LYXP_SET_NODE_SET) {
          __assert_fail("src->type == LYXP_SET_NODE_SET",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x373,"void set_fill_set(struct lyxp_set *, struct lyxp_set *)");
        }
        trg->type = LYXP_SET_NODE_SET;
        trg->used = src->used;
        trg->size = src->used;
        trg->ctx_pos = src->ctx_pos;
        trg->ctx_size = src->ctx_size;
        plVar1 = (lyxp_set_node *)malloc((ulong)trg->used << 4);
        (trg->val).nodes = plVar1;
        if ((trg->val).nodes == (lyxp_set_node *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_fill_set");
          memset(trg,0,0x40);
        }
        else {
          memcpy((trg->val).nodes,(src->val).nodes,(ulong)src->used << 4);
          phVar3 = lyht_dup(src->ht);
          trg->ht = phVar3;
        }
      }
    }
  }
  return;
}

Assistant:

static void
set_fill_set(struct lyxp_set *trg, struct lyxp_set *src)
{
    if (!trg || !src) {
        return;
    }

    if (src->type == LYXP_SET_SNODE_SET) {
        trg->type = LYXP_SET_SNODE_SET;
        trg->used = src->used;
        trg->size = src->used;

        trg->val.snodes = ly_realloc(trg->val.snodes, trg->size * sizeof *trg->val.nodes);
        LY_CHECK_ERR_RETURN(!trg->val.nodes, LOGMEM(NULL); memset(trg, 0, sizeof *trg), );
        memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
    } else if (src->type == LYXP_SET_BOOLEAN) {
        set_fill_boolean(trg, src->val.bool);
    } else if (src->type ==  LYXP_SET_NUMBER) {
        set_fill_number(trg, src->val.num);
    } else if (src->type == LYXP_SET_STRING) {
        set_fill_string(trg, src->val.str, strlen(src->val.str));
    } else {
        if (trg->type == LYXP_SET_NODE_SET) {
            free(trg->val.nodes);
        } else if (trg->type == LYXP_SET_STRING) {
            free(trg->val.str);
        }

        if (src->type == LYXP_SET_EMPTY) {
            trg->type = LYXP_SET_EMPTY;
        } else {
            assert(src->type == LYXP_SET_NODE_SET);

            trg->type = LYXP_SET_NODE_SET;
            trg->used = src->used;
            trg->size = src->used;
            trg->ctx_pos = src->ctx_pos;
            trg->ctx_size = src->ctx_size;

            trg->val.nodes = malloc(trg->used * sizeof *trg->val.nodes);
            LY_CHECK_ERR_RETURN(!trg->val.nodes, LOGMEM(NULL); memset(trg, 0, sizeof *trg), );
            memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
#ifdef LY_ENABLED_CACHE
            trg->ht = lyht_dup(src->ht);
#endif
        }
    }


}